

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O2

void __thiscall QDockWidgetGroupWindow::~QDockWidgetGroupWindow(QDockWidgetGroupWindow *this)

{
  *(undefined ***)this = &PTR_metaObject_007cf308;
  *(undefined ***)(this + 0x10) = &PTR__QDockWidgetGroupWindow_007cf4b8;
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)(this + 0x38));
  QWidget::~QWidget((QWidget *)this);
  return;
}

Assistant:

class Q_AUTOTEST_EXPORT QDockWidgetGroupWindow : public QWidget
{
    Q_OBJECT
public:
    explicit QDockWidgetGroupWindow(QWidget *parent = nullptr, Qt::WindowFlags f = {})
        : QWidget(parent, f)
    {
    }
    QDockAreaLayoutInfo *layoutInfo() const;
#if QT_CONFIG(tabbar)
    const QDockAreaLayoutInfo *tabLayoutInfo() const;
    QDockWidget *activeTabbedDockWidget() const;
#endif
    void destroyOrHideIfEmpty();
    bool hasVisibleDockWidgets() const;
    void adjustFlags();
    bool hasNativeDecos() const;

    bool hover(QLayoutItem *widgetItem, const QPoint &mousePos);
    void updateCurrentGapRect();
    void restore();
    void apply();
    void childEvent(QChildEvent *event) override;
    void reparentToMainWindow(QDockWidget *dockWidget);
    void destroyIfSingleItemLeft();
    QList<QDockWidget *> dockWidgets() const { return findChildren<QDockWidget *>(); }

    QRect currentGapRect;
    QList<int> currentGapPos;

signals:
    void resized();

protected:
    bool event(QEvent *) override;
    bool eventFilter(QObject *obj, QEvent *event) override;
    void paintEvent(QPaintEvent*) override;

private:
    QSize m_removedFrameSize;
}